

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void sig_int_handler(int sig)

{
  sigaction *psVar1;
  
  if (sig == 2) {
    psVar1 = &fio_old_sig_int;
  }
  else {
    if (sig != 0xf) {
      if (sig == 0xd) {
        psVar1 = &fio_old_sig_pipe;
      }
      else {
        if (sig != 10) {
          return;
        }
        fio_signal_children_flag = '\x01';
        psVar1 = &fio_old_sig_usr1;
      }
      goto LAB_00135639;
    }
    psVar1 = &fio_old_sig_term;
  }
  if (fio_data != (fio_data_s *)0x0) {
    fio_data->active = '\0';
  }
LAB_00135639:
  if ((psVar1->__sigaction_handler).sa_handler <= &DAT_00000001) {
    return;
  }
  (*(psVar1->__sigaction_handler).sa_handler)(sig);
  return;
}

Assistant:

static void sig_int_handler(int sig) {
  struct sigaction *old = NULL;
  switch (sig) {
#if !FIO_DISABLE_HOT_RESTART
  case SIGUSR1:
    fio_signal_children_flag = 1;
    old = &fio_old_sig_usr1;
    break;
#endif
    /* fallthrough */
  case SIGINT:
    if (!old)
      old = &fio_old_sig_int;
    /* fallthrough */
  case SIGTERM:
    if (!old)
      old = &fio_old_sig_term;
    fio_stop();
    break;
  case SIGPIPE:
    if (!old)
      old = &fio_old_sig_pipe;
  /* fallthrough */
  default:
    break;
  }
  /* propagate signale handling to previous existing handler (if any) */
  if (old && old->sa_handler != SIG_IGN && old->sa_handler != SIG_DFL)
    old->sa_handler(sig);
}